

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<long_const&,pbrt::RandomizeStrategy_const&>
               (string *s,char *fmt,long *v,RandomizeStrategy *args)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long *in_RDX;
  string *in_RDI;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  long *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  string *psVar5;
  string *in_stack_fffffffffffffd90;
  string local_268 [8];
  string *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  string local_220 [32];
  stringstream local_200 [16];
  undefined1 local_1f0 [8];
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  LogLevel in_stack_fffffffffffffe34;
  string local_78 [24];
  RandomizeStrategy *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  string *in_stack_ffffffffffffffb0;
  string local_40 [40];
  long *local_18;
  string *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  copyToFormatString(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  lVar1 = std::__cxx11::string::find((char)local_40,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_40,0x73);
  lVar3 = std::__cxx11::string::find((char)local_40,100);
  if (lVar1 == -1) {
    if (lVar3 == -1) {
      if (lVar2 == -1) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   in_stack_fffffffffffffe18);
        }
        std::__cxx11::string::c_str();
        formatOne<long_const&>(in_stack_fffffffffffffdb8,(long *)in_stack_fffffffffffffdb0);
        std::__cxx11::string::operator+=(local_8,local_268);
        std::__cxx11::string::~string(local_268);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_200);
        std::ostream::operator<<(local_1f0,*local_18);
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        std::__cxx11::string::c_str();
        formatOne<char_const*>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        std::__cxx11::string::operator+=(local_8,local_220);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
        std::__cxx11::stringstream::~stringstream(local_200);
      }
    }
    else {
      psVar5 = local_40;
      uVar4 = std::__cxx11::string::find((char)psVar5,100);
      IntegerFormatTrait<long>::fmt();
      std::__cxx11::string::replace((ulong)psVar5,uVar4,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<long_const&>(in_stack_fffffffffffffdb8,(long *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(local_8,local_78);
      std::__cxx11::string::~string(local_78);
    }
    stringPrintfRecursive<pbrt::RandomizeStrategy_const&>
              (in_stack_ffffffffffffffb0,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0);
  }
  else {
    stringPrintfRecursiveWithPrecision<long_const&,pbrt::RandomizeStrategy_const&>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78,(RandomizeStrategy *)0x78745d);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}